

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O2

void RigidBodyDynamics::InverseDynamicsConstraintsRelaxed
               (Model *model,VectorNd *Q,VectorNd *QDot,VectorNd *QDDotControls,ConstraintSet *CS,
               VectorNd *QDDotOutput,VectorNd *TauOutput,bool update_kinematics,
               vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *f_ext)

{
  long lVar1;
  ConstraintSet *pCVar2;
  ConstraintSet *pCVar3;
  ConstraintSet *dst;
  ConstraintSet *pCVar4;
  ConstraintSet *dst_00;
  ConstraintSet *pCVar5;
  ConstraintSet *pCVar6;
  EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *matrix;
  ConstraintSet *dst_01;
  ConstraintSet *dst_02;
  ConstraintSet *dst_03;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  double *pdVar11;
  ulong uVar12;
  int iVar13;
  VectorNd *pVVar14;
  ulong uVar16;
  RhsNested pMVar17;
  uint uVar18;
  non_const_type pMVar19;
  int local_130;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_e0;
  undefined1 local_b8 [24];
  scalar_constant_op<double> local_a0;
  variable_if_dynamic<long,__1> local_98;
  LhsNested LStack_90;
  ConstraintSet *local_88;
  RhsNested local_80;
  ConstraintSet *local_78;
  ConstraintSet *local_70;
  VectorNd *local_60;
  VectorNd local_58;
  ConstraintSet *local_48;
  ConstraintSet *local_40;
  ConstraintSet *local_38;
  non_const_type pMVar15;
  
  pVVar14 = QDDotControls;
  local_60 = QDDotOutput;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)TauOutput);
  CalcConstrainedSystemVariables(model,Q,QDot,pVVar14,CS,update_kinematics,f_ext);
  pCVar2 = CS + 0x160;
  uVar16 = *(ulong *)(CS + 0x168);
  uVar12 = *(long *)(CS + 0x28) - *(long *)(CS + 0x20) >> 5;
  pCVar3 = CS + 0x1e8;
  local_b8._8_8_ = *(undefined8 *)(CS + 0x1f0);
  local_b8._16_8_ = *(undefined8 *)(CS + 0x1f8);
  uVar7 = *(ulong *)(CS + 0x1f0);
  iVar13 = (int)uVar16;
  pMVar15 = (non_const_type)(ulong)(uint)(iVar13 - (int)uVar7);
  local_a0.m_other = 100.0;
  dst = CS + 0x218;
  local_98.m_value = (long)pCVar3;
  local_88 = pCVar2;
  local_80.m_matrix = (non_const_type)pCVar3;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)dst,
             (Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
              *)local_b8);
  local_b8._0_8_ = dst;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Inverse<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)(CS + 0x230),
             (Inverse<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_b8);
  pCVar4 = CS + 0x178;
  dst_00 = CS + 0x248;
  local_b8._0_8_ = CS + 0x230;
  local_b8._8_8_ = pCVar3;
  local_b8._16_8_ = pCVar4;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)dst_00,
             (Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
              *)local_b8);
  pCVar5 = CS + 0x278;
  pMVar17 = (RhsNested)(uVar7 & 0xffffffff);
  local_b8._0_8_ = *(undefined8 *)(CS + 0x278);
  local_88 = *(ConstraintSet **)(CS + 0x280);
  local_98.m_value = 0;
  LStack_90.m_matrix = (non_const_type)0x0;
  local_e0.m_lhs.m_lhs.m_lhs = (LhsNested)pCVar3;
  local_e0.m_lhs.m_lhs.m_rhs = (RhsNested)pCVar2;
  local_e0.m_lhs.m_rhs.m_matrix = (non_const_type)pCVar3;
  local_e0.m_rhs = (RhsNested)dst;
  local_b8._8_8_ = pMVar17;
  local_b8._16_8_ = pMVar17;
  local_a0.m_other = (double)pCVar5;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_b8,&local_e0);
  pCVar6 = CS + 0x200;
  local_88 = *(ConstraintSet **)(CS + 0x280);
  local_b8._0_8_ = (long)local_88 * (long)pMVar17 * 8 + *(long *)(CS + 0x278);
  local_98.m_value = 0;
  local_e0.m_lhs.m_lhs.m_lhs = (LhsNested)pCVar3;
  local_e0.m_lhs.m_lhs.m_rhs = (RhsNested)pCVar2;
  local_e0.m_lhs.m_rhs.m_matrix = (non_const_type)pCVar6;
  local_b8._8_8_ = pMVar17;
  local_b8._16_8_ = pMVar15;
  local_a0.m_other = (double)pCVar5;
  LStack_90.m_matrix = pMVar17;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_b8,
             &local_e0.m_lhs);
  lVar1 = (long)pMVar17 * 8;
  local_b8._0_8_ = *(long *)(CS + 0x278) + lVar1;
  local_88 = *(ConstraintSet **)(CS + 0x280);
  LStack_90.m_matrix = (non_const_type)0x0;
  local_e0.m_lhs.m_lhs.m_lhs = (LhsNested)pCVar6;
  local_e0.m_lhs.m_lhs.m_rhs = (RhsNested)pCVar2;
  local_e0.m_lhs.m_rhs.m_matrix = (non_const_type)pCVar3;
  local_b8._8_8_ = pMVar15;
  local_b8._16_8_ = pMVar17;
  local_a0.m_other = (double)pCVar5;
  local_98.m_value = (long)pMVar17;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_b8,
             &local_e0.m_lhs);
  local_88 = *(ConstraintSet **)(CS + 0x280);
  local_b8._0_8_ = *(long *)(CS + 0x278) + lVar1 + (long)local_88 * (long)pMVar17 * 8;
  local_e0.m_lhs.m_lhs.m_lhs = (LhsNested)pCVar6;
  local_e0.m_lhs.m_lhs.m_rhs = (RhsNested)pCVar2;
  local_e0.m_lhs.m_rhs.m_matrix = (non_const_type)pCVar6;
  local_b8._8_8_ = pMVar15;
  local_b8._16_8_ = pMVar15;
  local_a0.m_other = (double)pCVar5;
  local_98.m_value = (long)pMVar17;
  LStack_90.m_matrix = pMVar17;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_b8,
             &local_e0.m_lhs);
  matrix = (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(CS + 0x2f0);
  pMVar19 = (non_const_type)(uVar12 & 0xffffffff);
  local_b8._0_8_ = *(undefined8 *)(CS + 0x2f0);
  local_88 = *(ConstraintSet **)(CS + 0x2f8);
  local_98.m_value = 0;
  LStack_90.m_matrix = (non_const_type)0x0;
  local_e0.m_lhs.m_lhs.m_lhs = (LhsNested)pCVar3;
  local_e0.m_lhs.m_lhs.m_rhs = (RhsNested)(CS + 0x198);
  local_b8._8_8_ = pMVar17;
  local_b8._16_8_ = pMVar19;
  local_a0.m_other = (double)matrix;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_b8,
             (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
              *)&local_e0);
  local_b8._0_8_ = lVar1 + *(long *)(CS + 0x2f0);
  local_88 = *(ConstraintSet **)(CS + 0x2f8);
  LStack_90.m_matrix = (non_const_type)0x0;
  local_e0.m_lhs.m_lhs.m_lhs = (LhsNested)pCVar6;
  local_e0.m_lhs.m_lhs.m_rhs = (RhsNested)(CS + 0x198);
  local_b8._8_8_ = pMVar15;
  local_b8._16_8_ = pMVar19;
  local_a0.m_other = (double)matrix;
  local_98.m_value = (long)pMVar17;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_b8,
             (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
              *)&local_e0);
  Eigen::HouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  compute<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((HouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)(CS + 0x380),matrix);
  local_b8._8_8_ = CS + 0x398;
  local_b8._16_8_ = local_b8._16_8_ & 0xffffffffffffff00;
  local_a0.m_other = *(double *)(CS + 0x388);
  if ((long)*(double *)(CS + 0x390) < (long)*(double *)(CS + 0x388)) {
    local_a0.m_other = *(double *)(CS + 0x390);
  }
  local_98.m_value = 0;
  pCVar2 = CS + 0x458;
  local_b8._0_8_ = (HouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)(CS + 0x380);
  Eigen::
  HouseholderSequence<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,1>::
  evalTo<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((HouseholderSequence<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,1>
              *)local_b8,(Matrix<double,__1,__1,_0,__1,__1> *)pCVar2);
  local_b8._0_8_ = pCVar2;
  local_b8._8_8_ = matrix;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)(CS + 0x4b8),
             (Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
              *)local_b8);
  local_b8._0_8_ = *(undefined8 *)(CS + 0x4b8);
  local_88 = *(ConstraintSet **)(CS + 0x4c0);
  local_98.m_value = 0;
  LStack_90.m_matrix = (non_const_type)0x0;
  dst_01 = CS + 0x348;
  local_b8._8_8_ = pMVar19;
  local_b8._16_8_ = pMVar19;
  local_a0.m_other = (double)(CS + 0x4b8);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)dst_01,
             (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_b8);
  uVar16 = uVar16 & 0xffffffff;
  local_b8._0_8_ = *(undefined8 *)(CS + 0x458);
  local_88 = *(ConstraintSet **)(CS + 0x460);
  local_98.m_value = 0;
  LStack_90.m_matrix = (non_const_type)0x0;
  dst_02 = CS + 0x488;
  local_b8._8_8_ = uVar16;
  local_b8._16_8_ = pMVar19;
  local_a0.m_other = (double)pCVar2;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)dst_02,
             (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_b8);
  local_88 = *(ConstraintSet **)(CS + 0x460);
  local_b8._0_8_ = (long)local_88 * (long)pMVar19 * 8 + *(long *)(CS + 0x458);
  local_130 = (int)uVar12;
  local_b8._16_8_ = ZEXT48((uint)(iVar13 - local_130));
  local_98.m_value = 0;
  dst_03 = CS + 0x4a0;
  local_b8._8_8_ = uVar16;
  local_a0.m_other = (double)pCVar2;
  LStack_90.m_matrix = pMVar19;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)dst_03,
             (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_b8);
  local_b8._0_8_ = pCVar3;
  local_b8._8_8_ = pCVar4;
  local_b8._16_8_ = dst;
  local_a0.m_other = (double)pCVar3;
  local_98.m_value = (long)QDDotControls;
  LStack_90.m_matrix = (non_const_type)pCVar3;
  local_88 = dst_00;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>,0>,0>const>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)(CS + 600),
             (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>,_0>,_0>_>
              *)local_b8);
  local_b8._0_8_ = pCVar6;
  local_b8._8_8_ = pCVar4;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)(CS + 0x268),
             (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
              *)local_b8);
  lVar1 = *(long *)(CS + 0x1f0);
  lVar8 = *(long *)(CS + 600);
  lVar9 = *(long *)(CS + 0x338);
  for (uVar18 = 0; uVar16 = (ulong)uVar18, (long)uVar16 < lVar1; uVar18 = uVar18 + 1) {
    *(undefined8 *)(lVar9 + uVar16 * 8) = *(undefined8 *)(lVar8 + uVar16 * 8);
  }
  lVar8 = *(long *)(CS + 0x208);
  lVar9 = *(long *)(CS + 0x268);
  lVar10 = *(long *)(CS + 0x338);
  for (uVar18 = 0; (long)(ulong)uVar18 < lVar8; uVar18 = uVar18 + 1) {
    *(undefined8 *)(lVar10 + (ulong)(uVar18 + (int)lVar1) * 8) =
         *(undefined8 *)(lVar9 + (ulong)uVar18 * 8);
  }
  local_e0.m_lhs.m_lhs.m_lhs = (LhsNested)dst_01;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_b8,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)&local_e0);
  pCVar2 = CS + 0x360;
  SolveLinearSystem((MatrixNd *)local_b8,(VectorNd *)(CS + 0x188),(VectorNd *)pCVar2,
                    *(LinearSolver *)CS);
  free((void *)local_b8._0_8_);
  local_48 = dst_03;
  local_40 = pCVar5;
  local_38 = dst_03;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_e0,
             (DenseBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
              *)&local_48);
  local_b8._0_8_ = dst_03;
  local_b8._16_8_ = pCVar5;
  local_98.m_value = (long)dst_02;
  LStack_90.m_matrix = (non_const_type)pCVar2;
  local_88 = CS + 0x338;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const,Eigen::Matrix<double,_1,1,0,_1,1>const>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_58,
             (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>_>
              *)local_b8);
  pCVar4 = CS + 0x370;
  SolveLinearSystem((MatrixNd *)&local_e0,&local_58,(VectorNd *)pCVar4,*(LinearSolver *)CS);
  free(local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(local_e0.m_lhs.m_lhs.m_lhs);
  local_b8._0_8_ = dst_02;
  local_b8._16_8_ = CS + 0x338;
  local_a0.m_other = (double)pCVar5;
  local_98.m_value = (long)dst_02;
  LStack_90.m_matrix = (non_const_type)pCVar2;
  local_80.m_matrix = (non_const_type)pCVar5;
  local_78 = dst_03;
  local_70 = pCVar4;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_e0,
             (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>,_0>_>
              *)local_b8);
  SolveLinearSystem((MatrixNd *)dst_01,(VectorNd *)&local_e0,(VectorNd *)(CS + 0x130),
                    *(LinearSolver *)CS);
  free(local_e0.m_lhs.m_lhs.m_lhs);
  pVVar14 = local_60;
  local_b8._0_8_ = dst_02;
  local_b8._8_8_ = pCVar2;
  local_b8._16_8_ = dst_03;
  local_a0.m_other = (double)pCVar4;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>>
            (local_60,(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                       *)local_b8);
  lVar1 = *(long *)(CS + 0x1f0);
  lVar8 = *(long *)(CS + 600);
  pdVar11 = (pVVar14->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
            m_data;
  for (uVar18 = 0; uVar16 = (ulong)uVar18, (long)uVar16 < lVar1; uVar18 = uVar18 + 1) {
    *(double *)(lVar8 + uVar16 * 8) = pdVar11[uVar16];
  }
  lVar8 = *(long *)(CS + 0x208);
  lVar9 = *(long *)(CS + 0x268);
  pdVar11 = (pVVar14->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
            m_data;
  for (uVar18 = 0; (long)(ulong)uVar18 < lVar8; uVar18 = uVar18 + 1) {
    *(double *)(lVar9 + (ulong)uVar18 * 8) = pdVar11[uVar18 + (int)lVar1];
  }
  local_b8._0_8_ = pCVar3;
  local_b8._8_8_ = CS + 600;
  local_b8._16_8_ = pCVar6;
  local_a0.m_other = (double)(CS + 0x268);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>>
            (pVVar14,(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                      *)local_b8);
  local_78 = (ConstraintSet *)pVVar14;
  local_b8._0_8_ = pCVar3;
  local_b8._8_8_ = dst;
  local_b8._16_8_ = pCVar3;
  local_98.m_value = (long)QDDotControls;
  LStack_90.m_matrix = (non_const_type)pCVar3;
  local_88 = dst_00;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>,0>>
            (TauOutput,
             (Product<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>
              *)local_b8);
  return;
}

Assistant:

RBDL_DLLAPI
void InverseDynamicsConstraintsRelaxed(
  Model &model,
  const Math::VectorNd &Q,
  const Math::VectorNd &QDot,
  const Math::VectorNd &QDDotControls,
  ConstraintSet &CS,
  Math::VectorNd &QDDotOutput,
  Math::VectorNd &TauOutput,
  bool update_kinematics,
  std::vector<Math::SpatialVector> *f_ext)
{
  LOG << "-------- " << __func__ << " --------" << std::endl;

  //Check that the input vectors and matricies are sized appropriately
  assert(Q.size()               == model.q_size);
  assert(QDot.size()            == model.qdot_size);
  assert(QDDotControls.size()    == model.dof_count);
  assert(CS.S.cols()            == model.dof_count);
  assert(CS.W.rows()            == CS.W.cols());
  assert(CS.W.rows()            == CS.S.rows());
  assert(QDDotOutput.size()     == model.dof_count);

  TauOutput.setZero();
  CalcConstrainedSystemVariables(model,Q,QDot,TauOutput,CS,update_kinematics,
                                f_ext);

  unsigned int n  = unsigned(    CS.H.rows());
  unsigned int nc = unsigned( CS.name.size());
  unsigned int na = unsigned(    CS.S.rows());
  unsigned int nu = n-na;

  //MM 2020/5/29:
  //  The updates I made to Henning's original formulation have
  //  almost certainly made the sensitivity of the resulting qdd
  //  w.r.t. the controls poorly scaled. At least this is a suspicion
  //  of mine looking at how an OCP is behaving when using this operator.
  //  Reverting to the original formulation.
  //MM: Update to Henning's formulation s.t. the relaxed IDC operator will
  //    more closely satisfy QDDotControls if it is possible.
  //double diag = 0.;//100.*CS.H.maxCoeff();
  //double diagInv = 0.;
  //for(unsigned int i=0; i<CS.H.rows(); ++i) {
  //  for(unsigned int j=0; j<CS.H.cols(); ++j) {
  //    if(fabs(CS.H(i,j)) > diag) {
  //      diag = fabs(CS.H(i,j));
  //    }
  //  }
  //}
  //diag = diag*100.;
  //diagInv = 1.0/diag;
  //for(unsigned int i=0; i<CS.W.rows(); ++i) {
  //  CS.W(i,i)    = diag;
  //  CS.Winv(i,i) = diagInv;
  //}

  CS.W = 100.0*CS.S*CS.H*CS.S.transpose();
  CS.Winv = CS.W.inverse();
  CS.WinvSC = CS.Winv * CS.S * CS.C;

  //CS.W = CS.S*CS.H*CS.S.transpose();

  CS.F.block(  0,  0, na, na) = CS.S*CS.H*CS.S.transpose() + CS.W;
  CS.F.block(  0, na, na, nu) = CS.S*CS.H*CS.P.transpose();
  CS.F.block( na,  0, nu, na) = CS.P*CS.H*CS.S.transpose();
  CS.F.block( na, na, nu, nu) = CS.P*CS.H*CS.P.transpose();

  CS.GT.block(  0, 0,na, nc) = CS.S*(CS.G.transpose());
  CS.GT.block( na, 0,nu, nc) = CS.P*(CS.G.transpose());

  CS.GT_qr.compute (CS.GT);
  CS.GT_qr.householderQ().evalTo (CS.GT_qr_Q);

  //GT = [Y  Z] * [ R ]
  //              [ 0 ]

  CS.R  = CS.GT_qr_Q.transpose()*CS.GT;
  CS.Ru = CS.R.block(0,0,nc,nc);

  CS.Y = CS.GT_qr_Q.block( 0, 0,  n, nc    );
  CS.Z = CS.GT_qr_Q.block( 0, nc, n, (n-nc));

  //MM: Update to Henning's formulation s.t. the relaxed IDC operator will
  //    exactly satisfy QDDotControls if it is possible.
  //
  //Modify QDDotControls so that SN is cancelled.
  //
  //    +SC - WS(qdd*)
  //
  // Add a term to cancel off SN
  //
  //    +SC - WS( qdd* + (S' W^-1 S)N )
  //

  CS.u = CS.S*CS.C - CS.W*(CS.S*(QDDotControls
                                 +(CS.S.transpose()*CS.WinvSC)));
  //CS.u =  CS.S*CS.C - CS.W*(CS.S*QDDotControls);
  CS.v =  CS.P*CS.C;

  for(unsigned int i=0; i<CS.S.rows(); ++i) {
    CS.g[i] = CS.u[i];
  }
  unsigned int j=CS.S.rows();
  for(unsigned int i=0; i<CS.P.rows(); ++i) {
    CS.g[j] = CS.v[i];
    ++j;
  }

  //nc x nc system
  SolveLinearSystem(CS.Ru.transpose(), CS.gamma, CS.py, CS.linear_solver);

  //(n-nc) x (n-nc) system
  SolveLinearSystem(CS.Z.transpose()*CS.F*CS.Z,
                    CS.Z.transpose()*(-CS.F*CS.Y*CS.py-CS.g),
                    CS.pz,
                    CS.linear_solver);

  //nc x nc system
  SolveLinearSystem(CS.Ru,
                    CS.Y.transpose()*(CS.g + CS.F*CS.Y*CS.py + CS.F*CS.Z*CS.pz),
                    CS.force, CS.linear_solver);

  //Eqn. 32d, the equation for qdd, is in error. Instead
  // p = Ypy + Zpz = [v,w]
  // qdd = S'v + P'w
  QDDotOutput = CS.Y*CS.py + CS.Z*CS.pz;
  for(unsigned int i=0; i<CS.S.rows(); ++i) {
    CS.u[i] = QDDotOutput[i];
  }
  j = CS.S.rows();
  for(unsigned int i=0; i<CS.P.rows(); ++i) {
    CS.v[i] = QDDotOutput[j];
    ++j;
  }

  QDDotOutput = CS.S.transpose()*CS.u
                +CS.P.transpose()*CS.v;

  TauOutput = (CS.S.transpose()*CS.W*CS.S)*(
                QDDotControls+(CS.S.transpose()*CS.WinvSC)
                -QDDotOutput);
  //TauOutput =  CS.S.transpose()*CS.W*CS.S*(QDDotControls - QDDotOutput);


}